

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<unsigned_int>::append<unsigned_int_const*,void>
          (SmallVectorImpl<unsigned_int> *this,uint *in_start,uint *in_end)

{
  void *pvVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_type NumInputs;
  uint *in_end_local;
  uint *in_start_local;
  SmallVectorImpl<unsigned_int> *this_local;
  
  uVar2 = std::distance<unsigned_int_const*>(in_start,in_end);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  sVar4 = SmallVectorBase::size((SmallVectorBase *)this);
  if (sVar3 - sVar4 < uVar2) {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorTemplateBase<unsigned_int,_true>::grow
              (&this->super_SmallVectorTemplateBase<unsigned_int,_true>,sVar3 + uVar2);
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_int,_true>).
           super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorTemplateBase<unsigned_int,true>::uninitialized_copy<unsigned_int_const,unsigned_int>
            (in_start,in_end,(uint *)((long)pvVar1 + sVar3 * 4),(type *)0x0);
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar3 + uVar2);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }